

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall
UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
          (UniQueue<FileTarget> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2)

{
  set<FileTarget,_std::less<FileTarget>,_std::allocator<FileTarget>_> *this_00;
  iterator *piVar1;
  _Elt_pointer prVar2;
  pair<std::_Rb_tree_iterator<FileTarget>,_bool> pVar3;
  _Map_pointer local_b0;
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  iterator local_70;
  PackFormat *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  reference_wrapper<const_FileTarget> local_38;
  KEY key;
  
  if (this->dirty == true) {
    emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>();
  }
  this_00 = &this->unique;
  pVar3 = std::
          _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                    ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                      *)this_00,s,s_1,s_2);
  local_38._M_data = (FileTarget *)((_Base_ptr)pVar3.first._M_node + 1);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    it._M_node = (_Map_pointer)
                 (this->
                 super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ).
                 super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_70._M_cur._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_70._M_cur._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
    local_70._M_first._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_70._M_first._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
    local_70._M_last._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_70._M_last._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    local_70._M_node._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_70._M_node._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    local_50 = s_2;
    local_48 = s_1;
    local_40 = s;
    std::
    __find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,__gnu_cxx::__ops::_Iter_pred<UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>(std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>>
              (&local_b0,&it._M_node,&local_70,&local_38);
    it._M_node = local_b0;
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::_M_erase(&local_70,
               &this->
                super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
               ,(iterator *)&it._M_node);
    std::
    _Rb_tree<FileTarget,_FileTarget,_std::_Identity<FileTarget>,_std::less<FileTarget>,_std::allocator<FileTarget>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node);
    pVar3 = std::
            _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                      ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,local_40,local_48,local_50);
    local_38._M_data = (FileTarget *)(pVar3.first._M_node._M_node + 1);
  }
  prVar2 = (this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (prVar2 == (this->
                super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                ).
                super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::reference_wrapper<FileTarget_const>,std::allocator<std::reference_wrapper<FileTarget_const>>>
    ::_M_push_back_aux<std::reference_wrapper<FileTarget_const>const&>
              ((deque<std::reference_wrapper<FileTarget_const>,std::allocator<std::reference_wrapper<FileTarget_const>>>
                *)this,&local_38);
  }
  else {
    prVar2->_M_data = local_38._M_data;
    piVar1 = &(this->
              super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ).
              super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }